

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this)

{
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_0019b2d0;
  this->m_level = Unknown;
  (this->m_userFormat)._M_dataplus._M_p = (pointer)&(this->m_userFormat).field_2;
  (this->m_userFormat)._M_string_length = 0;
  (this->m_userFormat).field_2._M_local_buf[0] = '\0';
  (this->m_format)._M_dataplus._M_p = (pointer)&(this->m_format).field_2;
  (this->m_format)._M_string_length = 0;
  (this->m_format).field_2._M_local_buf[0] = '\0';
  (this->m_dateTimeFormat)._M_dataplus._M_p = (pointer)&(this->m_dateTimeFormat).field_2;
  (this->m_dateTimeFormat)._M_string_length = 0;
  (this->m_dateTimeFormat).field_2._M_local_buf[0] = '\0';
  this->m_flags = 0;
  utils::OS::currentUser_abi_cxx11_();
  utils::OS::currentHost_abi_cxx11_();
  return;
}

Assistant:

LogFormat::LogFormat(void) :
  m_level(Level::Unknown),
  m_userFormat(base::type::string_t()),
  m_format(base::type::string_t()),
  m_dateTimeFormat(std::string()),
  m_flags(0x0),
  m_currentUser(base::utils::OS::currentUser()),
  m_currentHost(base::utils::OS::currentHost()) {
}